

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O3

Set __thiscall
groundupdbext::FileKeyValueStore::getKeyValueSet(FileKeyValueStore *this,HashedValue *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  char cVar5;
  char cVar6;
  size_t __val;
  long *plVar7;
  __buckets_ptr pp_Var8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var12;
  undefined8 uVar13;
  size_t sVar14;
  size_type *psVar15;
  HashedValue *in_RDX;
  size_type sVar16;
  int iVar17;
  void *pvVar18;
  bool hasValue;
  __alloc_node_gen_t __alloc_node_gen;
  int length;
  string cd;
  Type type;
  int entries;
  size_t hash;
  Bytes bytes;
  string fp;
  string keyHash;
  unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
  values;
  string eol;
  ifstream t;
  char local_331;
  _AllocNode<std::allocator<std::__detail::_Hash_node<groundupdb::EncodedValue,_true>_>_> local_330;
  undefined4 local_324;
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_320;
  size_type local_318;
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  local_310;
  undefined7 uStack_30f;
  undefined4 local_300;
  int local_2fc;
  _Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  local_2f8;
  ulong local_2f0;
  vector<std::byte,_std::allocator<std::byte>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  long *local_2b0;
  uint local_2a8;
  long local_2a0 [2];
  _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_290;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  path local_238 [13];
  
  local_2f8.
  super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
        )(_Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
          )this;
  __val = groundupdb::HashedValue::hash(in_RDX);
  cVar5 = '\x01';
  if (9 < __val) {
    sVar14 = __val;
    cVar6 = '\x04';
    do {
      cVar5 = cVar6;
      if (sVar14 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00126db6;
      }
      if (sVar14 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00126db6;
      }
      if (sVar14 < 10000) goto LAB_00126db6;
      bVar3 = 99999 < sVar14;
      sVar14 = sVar14 / 10000;
      cVar6 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00126db6:
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0,local_2a8,__val);
  lVar10 = **(long **)&key->m_has_value;
  local_290._M_buckets = &local_290._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,lVar10,(*(long **)&key->m_has_value)[1] + lVar10);
  std::__cxx11::string::append((char *)&local_290);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_2b0);
  paVar1 = &local_238[0]._M_pathname.field_2;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_238[0]._M_pathname.field_2._0_8_ = *psVar15;
    local_238[0]._M_pathname.field_2._8_8_ = plVar7[3];
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_238[0]._M_pathname.field_2._0_8_ = *psVar15;
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_238[0]._M_pathname._M_string_length = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_238);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar15 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_2d0.field_2._M_allocated_capacity = *psVar15;
    local_2d0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar15;
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_238[0]._M_pathname._M_dataplus._M_p,
                    local_238[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((__node_base *)local_290._M_buckets != &local_290._M_before_begin) {
    operator_delete(local_290._M_buckets,
                    (ulong)((long)&(local_290._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (local_238,&local_2d0,auto_format);
  cVar5 = std::filesystem::status(local_238);
  std::filesystem::__cxx11::path::~path(local_238);
  if ((cVar5 == -1) || (cVar5 == '\0')) {
    pp_Var8 = (__buckets_ptr)operator_new(0x38);
    pp_Var8[4] = (__node_base_ptr)0x0;
    pp_Var8[5] = (__node_base_ptr)0x0;
    *pp_Var8 = (__node_base_ptr)(pp_Var8 + 6);
    pp_Var8[1] = (__node_base_ptr)0x1;
    pp_Var8[2] = (__node_base_ptr)0x0;
    pp_Var8[3] = (__node_base_ptr)0x0;
    *(undefined4 *)(pp_Var8 + 4) = 0x3f800000;
    pp_Var8[5] = (__node_base_ptr)0x0;
    pp_Var8[6] = (__node_base_ptr)0x0;
    ((_Hashtable *)
    local_2f8.
    super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
    ._M_head_impl)->_M_buckets = pp_Var8;
  }
  else {
    std::ifstream::ifstream(local_238,(string *)&local_2d0,_S_in);
    local_290._M_buckets = &local_290._M_single_bucket;
    local_290._M_bucket_count = 1;
    local_290._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_290._M_element_count = 0;
    local_290._M_rehash_policy._M_max_load_factor = 1.0;
    local_290._M_rehash_policy._M_next_resize = 0;
    local_290._M_single_bucket = (__node_base_ptr)0x0;
    local_258 = &local_248;
    local_250 = 0;
    local_248 = 0;
    std::istream::operator>>((istream *)local_238,&local_2fc);
    cVar5 = std::ios::widen((char)local_238 +
                            (char)*(undefined8 *)(local_238[0]._M_pathname._M_dataplus._M_p + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_258,cVar5);
    local_320 = &local_310;
    local_318 = 0;
    local_310 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 )0x0;
    local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_324 = 0;
    local_2f0 = 0;
    if (0 < local_2fc) {
      iVar17 = 0;
      do {
        std::istream::_M_extract<bool>((bool *)local_238);
        cVar5 = (char)local_238;
        cVar6 = std::ios::widen((char)*(undefined8 *)
                                       (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) + cVar5);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_258,cVar6);
        if (local_331 == '\x01') {
          local_318 = 0;
          *local_320 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        )0x0;
          cVar6 = std::ios::widen((char)*(undefined8 *)
                                         (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) + cVar5
                                 );
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_320,cVar6);
          p_Var12 = local_320;
          puVar9 = (uint *)__errno_location();
          uVar2 = *puVar9;
          pvVar18 = (void *)(ulong)uVar2;
          *puVar9 = 0;
          lVar10 = strtol((char *)p_Var12,(char **)&local_330,10);
          if (local_330._M_h == (__hashtable_alloc *)p_Var12) {
LAB_00127483:
            std::__throw_invalid_argument("stoi");
LAB_0012748f:
            std::__throw_out_of_range("stoi");
LAB_0012749b:
            std::__throw_out_of_range("stoi");
          }
          else {
            if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*puVar9 == 0x22)) goto LAB_0012748f;
            if (*puVar9 == 0) {
              *puVar9 = uVar2;
            }
            local_300 = (undefined4)lVar10;
            local_318 = 0;
            *local_320 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          )0x0;
            cVar6 = std::ios::widen((char)*(undefined8 *)
                                           (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                    cVar5);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_320,cVar6);
            p_Var12 = local_320;
            uVar2 = *puVar9;
            pvVar18 = (void *)(ulong)uVar2;
            *puVar9 = 0;
            lVar10 = strtol((char *)local_320,(char **)&local_330,10);
            if (local_330._M_h == (__hashtable_alloc *)p_Var12) {
              std::__throw_invalid_argument("stoi");
              goto LAB_00127483;
            }
            if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*puVar9 == 0x22)) goto LAB_0012749b;
            if (*puVar9 == 0) {
              *puVar9 = uVar2;
            }
            local_324 = (undefined4)lVar10;
            local_318 = 0;
            *local_320 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          )0x0;
            cVar5 = std::ios::widen((char)*(undefined8 *)
                                           (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                    cVar5);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_320,cVar5);
            if (local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<std::byte,_std::allocator<std::byte>_>::reserve(&local_2e8,local_318);
            sVar4 = local_318;
            p_Var12 = local_320;
            if (local_318 != 0) {
              sVar16 = 0;
              do {
                local_330._M_h._0_1_ = p_Var12[sVar16];
                std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
                          (&local_2e8,(byte *)&local_330);
                sVar16 = sVar16 + 1;
              } while (sVar4 != sVar16);
            }
            local_318 = 0;
            *local_320 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          )0x0;
            cVar5 = std::ios::widen((char)*(undefined8 *)
                                           (local_238[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                    (char)local_238);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_320,cVar5);
            p_Var12 = local_320;
            uVar2 = *puVar9;
            pvVar18 = (void *)(ulong)uVar2;
            *puVar9 = 0;
            uVar11 = strtoul((char *)local_320,(char **)&local_330,10);
            if (local_330._M_h != (__hashtable_alloc *)p_Var12) {
              if (*puVar9 == 0) {
                *puVar9 = uVar2;
              }
              else if (*puVar9 == 0x22) goto LAB_001274b3;
              local_318 = 0;
              local_2f0 = uVar11;
              *local_320 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            )0x0;
              goto LAB_00127326;
            }
          }
          std::__throw_invalid_argument("stoul");
LAB_001274b3:
          uVar13 = std::__throw_out_of_range("stoul");
          operator_delete(pvVar18,0x38);
          if (local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_320 != &local_310) {
            operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
          }
          if (local_258 != &local_248) {
            operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
          }
          std::
          _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_290);
          std::ifstream::~ifstream(local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_2b0 != local_2a0) {
            operator_delete(local_2b0,local_2a0[0] + 1);
          }
          _Unwind_Resume(uVar13);
        }
        local_324 = 0;
        local_300 = 0;
        local_2f0 = 0;
LAB_00127326:
        std::
        _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_emplace<groundupdb::Type&,std::vector<std::byte,std::allocator<std::byte>>&,int&,unsigned_long&>
                  ((_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_290,&local_300,&local_2e8,&local_324,&local_2f0);
        iVar17 = iVar17 + 1;
      } while (iVar17 < local_2fc);
    }
    p_Var12 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)operator_new(0x38);
    *(undefined8 *)p_Var12 = 0;
    *(size_type *)(p_Var12 + 8) = local_290._M_bucket_count;
    *(undefined8 *)(p_Var12 + 0x10) = 0;
    *(size_type *)(p_Var12 + 0x18) = local_290._M_element_count;
    *(ulong *)(p_Var12 + 0x20) =
         CONCAT44(local_290._M_rehash_policy._4_4_,local_290._M_rehash_policy._M_max_load_factor);
    *(size_t *)(p_Var12 + 0x28) = local_290._M_rehash_policy._M_next_resize;
    *(undefined8 *)(p_Var12 + 0x30) = 0;
    local_330._M_h = (__hashtable_alloc *)p_Var12;
    std::
    _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<groundupdb::EncodedValue,true>>>>
              (p_Var12,&local_290,&local_330);
    ((_Hashtable *)
    local_2f8.
    super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
    ._M_head_impl)->_M_buckets = (__buckets_ptr)p_Var12;
    if (local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_320 != &local_310) {
      operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
    }
    std::
    _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_290);
    std::ifstream::~ifstream(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  return (Set)(unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
               *)local_2f8.
                 super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
                 ._M_head_impl;
}

Assistant:

Set
FileKeyValueStore::getKeyValueSet(const HashedValue& key) {
  // get from _string_set.kl file
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  if (!fs::exists(fp)) {
    //std::cout << "FileKeyValueStore::getKeyValueSet returning empty set" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // TODO verify we don't need to specify type here
  }
  std::ifstream t(fp);
  std::unordered_set<EncodedValue> values;

  // read size first
  int entries;
  std::string eol; // eol can be multiple characters
  t >> entries;
  std::getline(t,eol);

  // Each value information
  bool hasValue;
  groundupdb::Type type;
  int tint;
  std::string cd;
  Bytes bytes;
  int length = 0;
  std::size_t hash = 0;
  std::size_t lengthSize = sizeof(length);
  std::size_t hashSize = sizeof(hash);
  for (int i = 0;i < entries;i++) {
    // read hasValue
    t >> hasValue;
    std::getline(t,eol);
    if (hasValue) {
      //std::cout << "  Entry has value" << std::endl;
      // type
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Type string: " << cd << std::endl;
      //t >> tint; // DOESN'T WORK!
      tint = std::stoi(cd);
      type = (groundupdb::Type)tint;
      // length
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Length string: " << cd << std::endl;
      //t >> length; // DOESN'T WORK!
      length = std::stoi(cd,&lengthSize);
      // data
      cd.clear();
      std::getline(t,cd);
      bytes.clear();
      bytes.reserve(cd.length());
      //std::cout << "    Expecting " << length << " bytes, read line of " << cd.length() << " bytes" << std::endl;
      //std::cout << "    Reading bytes: ";
      for (auto& c : cd) {
        //std::cout << ".";
        bytes.push_back((std::byte)c);
      }
      //std::cout << std::endl;
      // hash
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Read hash value (string) of: " << cd << std::endl;
      //t >> hash; // DOESN'T WORK!
      hash = std::stoul(cd,&hashSize);
      //std::cout << "    Reading and creating SET value with length: " << length << ", hash: " << hash << std::endl;
      cd.clear();
    } else {
      //std::cout << "  Entry DOES NOT have value" << std::endl;
      length = 0;
      type = groundupdb::Type::UNKNOWN;
      hash = 0;
    }
    values.emplace(type,bytes,length,hash);
  }
  //std::cout << "FileKeyValueStore::getKeyValueSet returning read results of size: " << values.size() << ", but entries in file of: " << entries << std::endl;
  return std::make_unique<std::unordered_set<EncodedValue>>(values);
}